

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O3

void __thiscall
ODDLParser::OpenDDLParserTest_getNextSeparatorTest_Test::TestBody
          (OpenDDLParserTest_getNextSeparatorTest_Test *this)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  char *in_R9;
  long lVar5;
  AssertionResult gtest_ar__1;
  char tokenlist [8];
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  byte local_40 [8];
  string local_38;
  
  local_40[0] = 0x61;
  local_40[1] = 0x62;
  local_40[2] = 99;
  local_40[3] = 0x2c;
  local_40[4] = 0x20;
  local_40[5] = 10;
  local_40[6] = 0x61;
  local_40[7] = 0;
  local_38._M_dataplus._M_p._0_1_ = 1;
  local_38._M_string_length = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar5 = 0;
  do {
    uVar3 = (ulong)local_40[lVar5];
    if (((uVar3 < 0x2d) && ((0x130100000200U >> (uVar3 & 0x3f) & 1) != 0)) ||
       ((uVar4 = local_40[lVar5] - 0x5b, uVar4 < 0x23 &&
        ((0x500000001U >> ((ulong)uVar4 & 0x3f) & 1) != 0)))) goto LAB_0013f41f;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 7);
  lVar5 = 7;
  uVar3 = 0;
LAB_0013f41f:
  bVar1 = (byte)uVar3;
  local_50[0] = (internal)
                (((bVar1 & 0xfe) == 0x28 || (bVar1 == 0x5b || bVar1 == 0x7d)) ||
                ((bVar1 == 0x7b || bVar1 == 0x2c) || (bVar1 == 9 || bVar1 == 0x20)));
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((0x2c < bVar1) || ((0x130100000200U >> (uVar3 & 0x3f) & 1) == 0)) &&
     ((uVar4 = (int)uVar3 - 0x5b, 0x22 < uVar4 || ((0x500000001U >> ((ulong)uVar4 & 0x3f) & 1) == 0)
      ))) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_50,(AssertionResult *)0x161c97,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x5f,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      local_38._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_),
                      local_38.field_2._M_allocated_capacity + 1);
    }
    if (((local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_60.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  for (; lVar5 != 7; lVar5 = lVar5 + 1) {
    bVar1 = local_40[lVar5];
    if ((((ulong)bVar1 < 0x2d) && ((0x130100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       ((bVar1 - 0x5b < 0x23 && ((0x500000001U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0))))
    goto LAB_0013f4ab;
  }
  bVar1 = local_40[7];
LAB_0013f4ab:
  local_50[0] = (internal)
                (((bVar1 & 0xfe) == 0x28 || (bVar1 == 0x5b || bVar1 == 0x7d)) ||
                ((bVar1 == 0x7b || bVar1 == 0x2c) || (bVar1 == 9 || bVar1 == 0x20)));
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((0x2c < bVar1) || ((0x130100000200U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) &&
     ((uVar4 = bVar1 - 0x5b, 0x22 < uVar4 || ((0x500000001U >> ((ulong)uVar4 & 0x3f) & 1) == 0)))) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_50,(AssertionResult *)0x161c97,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x62,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      local_38._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_),
                      local_38.field_2._M_allocated_capacity + 1);
    }
    if (((local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_60.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, getNextSeparatorTest) {
    char tokenlist[] = "abc, \na";
    char *in(&tokenlist[0]);
    char *end(&tokenlist[strlen("abc, \na")]);

    bool res(true);
    res = isSeparator(*in);
    EXPECT_FALSE(res);
    in = getNextSeparator(in, end);
    res = isSeparator(*in);
    EXPECT_TRUE(res);
    in = getNextSeparator(in, end);
    res = isSeparator(*in);
    EXPECT_TRUE(res);
}